

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

int yaml_check_utf8(yaml_char_t *start,size_t length)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  
  pbVar6 = start;
  do {
    do {
      if (start + length <= pbVar6) {
        return 1;
      }
      bVar2 = *pbVar6;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        uVar4 = (uint)bVar2;
        if ((uVar5 & 0xffffffe0) == 0xc0) {
          uVar5 = uVar5 & 0x1f;
          uVar3 = 2;
        }
        else {
          uVar3 = (uint)((uVar4 & 0xfffffff8) == 0xf0) << 2;
          if ((uVar4 & 0xfffffff0) == 0xe0) {
            uVar3 = 3;
            uVar5 = uVar5 & 0xf;
          }
          else {
            uVar5 = uVar4 & 7;
            if ((uVar4 & 0xfffffff8) != 0xf0) {
              uVar5 = 0;
            }
          }
          if (uVar3 == 0) {
            return 0;
          }
        }
      }
      else {
        uVar3 = 1;
      }
      pbVar1 = pbVar6 + uVar3;
      if (start + length < pbVar1) {
        return 0;
      }
      for (uVar7 = 1; uVar7 < uVar3; uVar7 = uVar7 + 1) {
        if ((pbVar6[uVar7] & 0xffffffc0) != 0x80) {
          return 0;
        }
        uVar5 = uVar5 << 6 | pbVar6[uVar7] & 0x3f;
      }
      pbVar6 = pbVar1;
    } while (((uVar3 == 1) || ((uVar3 == 2 && (0x7f < uVar5)))) || ((uVar3 == 3 && (0x7ff < uVar5)))
            );
    if (uVar3 != 4) {
      return 0;
    }
  } while (0xffff < uVar5);
  return 0;
}

Assistant:

static int
yaml_check_utf8(yaml_char_t *start, size_t length)
{
    yaml_char_t *end = start+length;
    yaml_char_t *pointer = start;

    while (pointer < end) {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        octet = pointer[0];
        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;
        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;
        if (!width) return 0;
        if (pointer+width > end) return 0;
        for (k = 1; k < width; k ++) {
            octet = pointer[k];
            if ((octet & 0xC0) != 0x80) return 0;
            value = (value << 6) + (octet & 0x3F);
        }
        if (!((width == 1) ||
            (width == 2 && value >= 0x80) ||
            (width == 3 && value >= 0x800) ||
            (width == 4 && value >= 0x10000))) return 0;

        pointer += width;
    }

    return 1;
}